

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::GenerateHierarchy(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  uint uVar1;
  aiMesh *paVar2;
  aiNode *paVar3;
  aiNode *paVar4;
  uint *puVar5;
  aiNode **ppaVar6;
  ulong uVar7;
  
  paVar4 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar4);
  pScene->mRootNode = paVar4;
  (paVar4->mName).length = 10;
  builtin_strncpy((paVar4->mName).data,"<DXF_ROOT>",0xb);
  uVar1 = pScene->mNumMeshes;
  if ((ulong)uVar1 == 1) {
    paVar4->mNumMeshes = 1;
    puVar5 = (uint *)operator_new__(4);
    paVar4->mMeshes = puVar5;
    *puVar5 = 0;
  }
  else {
    paVar4->mNumChildren = uVar1;
    ppaVar6 = (aiNode **)operator_new__((ulong)uVar1 << 3);
    paVar4->mChildren = ppaVar6;
    if (uVar1 != 0) {
      uVar7 = 0;
      do {
        paVar4 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar4);
        pScene->mRootNode->mChildren[uVar7] = paVar4;
        paVar2 = pScene->mMeshes[uVar7];
        if (paVar4 != (aiNode *)&paVar2->mName) {
          uVar1 = (paVar2->mName).length;
          (paVar4->mName).length = uVar1;
          memcpy((paVar4->mName).data,(paVar2->mName).data,(ulong)uVar1);
          (paVar4->mName).data[uVar1] = '\0';
        }
        paVar4->mNumMeshes = 1;
        puVar5 = (uint *)operator_new__(4);
        paVar4->mMeshes = puVar5;
        *puVar5 = (uint)uVar7;
        paVar3 = pScene->mRootNode;
        paVar4->mParent = paVar3;
        uVar7 = uVar7 + 1;
      } while (uVar7 < paVar3->mNumChildren);
    }
  }
  return;
}

Assistant:

void DXFImporter::GenerateHierarchy(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate the output scene graph, which is just the root node with a single child for each layer.
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<DXF_ROOT>");

    if (1 == pScene->mNumMeshes)    {
        pScene->mRootNode->mMeshes = new unsigned int[ pScene->mRootNode->mNumMeshes = 1 ];
        pScene->mRootNode->mMeshes[0] = 0;
    } else {
        pScene->mRootNode->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren = pScene->mNumMeshes ];
        for (unsigned int m = 0; m < pScene->mRootNode->mNumChildren;++m)   {
            aiNode* p = pScene->mRootNode->mChildren[m] = new aiNode();
            p->mName = pScene->mMeshes[m]->mName;

            p->mMeshes = new unsigned int[p->mNumMeshes = 1];
            p->mMeshes[0] = m;
            p->mParent = pScene->mRootNode;
        }
    }
}